

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_array.c
# Opt level: O1

ares_status_t ares_array_set_size(ares_array_t *arr,size_t size)

{
  size_t sVar1;
  void *pvVar2;
  ares_status_t aVar3;
  ulong uVar4;
  
  aVar3 = ARES_EFORMERR;
  if ((size != 0 && arr != (ares_array_t *)0x0) && (arr->cnt <= size)) {
    sVar1 = ares_round_up_pow2(size);
    uVar4 = 4;
    if (4 < sVar1) {
      uVar4 = sVar1;
    }
    aVar3 = ARES_SUCCESS;
    if (arr->alloc_cnt < uVar4) {
      pvVar2 = ares_realloc_zero(arr->arr,arr->alloc_cnt * arr->member_size,arr->member_size * uVar4
                                );
      if (pvVar2 == (void *)0x0) {
        aVar3 = ARES_ENOMEM;
      }
      else {
        arr->alloc_cnt = uVar4;
        arr->arr = pvVar2;
        aVar3 = ARES_SUCCESS;
      }
    }
  }
  return aVar3;
}

Assistant:

ares_status_t ares_array_set_size(ares_array_t *arr, size_t size)
{
  void *temp;

  if (arr == NULL || size == 0 || size < arr->cnt) {
    return ARES_EFORMERR;
  }

  /* Always operate on powers of 2 */
  size = ares_round_up_pow2(size);

  if (size < ARES__ARRAY_MIN) {
    size = ARES__ARRAY_MIN;
  }

  /* If our allocation size is already large enough, skip */
  if (size <= arr->alloc_cnt) {
    return ARES_SUCCESS;
  }

  temp = ares_realloc_zero(arr->arr, arr->alloc_cnt * arr->member_size,
                           size * arr->member_size);
  if (temp == NULL) {
    return ARES_ENOMEM;
  }
  arr->alloc_cnt = size;
  arr->arr       = temp;
  return ARES_SUCCESS;
}